

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall prometheus::anon_unknown_0::IntegrationTest::SetUp(IntegrationTest *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint __val;
  Exposer *pEVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  pointer *__ptr;
  ulong *unaff_R13;
  uint __len;
  string __str;
  vector<int,_std::allocator<int>_> ports;
  Exposer *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  vector<int,_std::allocator<int>_> local_48;
  
  detail::make_unique<prometheus::Exposer,char_const(&)[12]>
            ((detail *)&local_a8,(char (*) [12])"127.0.0.1:0");
  pEVar3 = local_a8;
  local_a8 = (Exposer *)0x0;
  std::__uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::reset
            ((__uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> *)
             &this->exposer_,pEVar3);
  pEVar3 = local_a8;
  if (local_a8 != (Exposer *)0x0) {
    Exposer::~Exposer(local_a8);
    operator_delete(pEVar3);
  }
  Exposer::GetListeningPorts
            (&local_48,
             (this->exposer_)._M_t.
             super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>.
             _M_t.
             super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>
             .super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"http://127.0.0.1:","");
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    if (local_88 != unaff_R13) {
      operator_delete(local_88);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(uVar6);
  }
  uVar2 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0011100c;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0011100c;
      }
      if (uVar7 < 10000) goto LAB_0011100c;
      uVar8 = uVar8 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0011100c:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_88),__len,__val);
  uVar8 = 0xf;
  if (local_68 != local_58) {
    uVar8 = local_58[0];
  }
  if (uVar8 < (ulong)(local_80 + local_60)) {
    uVar8 = 0xf;
    if (local_88 != local_78) {
      uVar8 = local_78[0];
    }
    if ((ulong)(local_80 + local_60) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_00111098;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_00111098:
  local_a8 = (Exposer *)&local_98;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar5[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (Exposer *)*puVar5;
  }
  local_a0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->base_url_,(string *)&local_a8);
  if (local_a8 != (Exposer *)&local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetUp() override {
    exposer_ = detail::make_unique<Exposer>("127.0.0.1:0");
    auto ports = exposer_->GetListeningPorts();
    base_url_ = std::string("http://127.0.0.1:") + std::to_string(ports.at(0));
  }